

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::OpenRangeListSyntax::OpenRangeListSyntax
          (OpenRangeListSyntax *this,Token openBrace,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *valueRanges,Token closeBrace)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar6 = closeBrace._0_8_;
  uVar5 = openBrace._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = OpenRangeList;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  SVar2 = (valueRanges->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(valueRanges->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->valueRanges).super_SyntaxListBase.super_SyntaxNode.parent =
       (valueRanges->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->valueRanges).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->valueRanges).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->valueRanges).super_SyntaxListBase.childCount =
       (valueRanges->super_SyntaxListBase).childCount;
  (this->valueRanges).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b090;
  sVar1 = (valueRanges->elements).size_;
  (this->valueRanges).elements.data_ = (valueRanges->elements).data_;
  (this->valueRanges).elements.size_ = sVar1;
  (this->closeBrace).kind = (short)uVar6;
  (this->closeBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeBrace).info = closeBrace.info;
  (this->valueRanges).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->valueRanges).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&this->valueRanges,index);
      (pEVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}